

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O0

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormals
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  ParameterSet *this_00;
  bool bVar1;
  DenoiseType denoise_type;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *pvStack_20;
  int denoise_index;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *filtered_normals_local;
  TriMesh *mesh_local;
  GuidedMeshNormalFiltering *this_local;
  
  this_00 = (this->super_MeshDenoisingBase).parameter_set_;
  pvStack_20 = filtered_normals;
  filtered_normals_local =
       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)mesh;
  mesh_local = (TriMesh *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Denoise Type",&local_49);
  bVar1 = ParameterSet::getValue(this_00,(string *)local_48,&local_24);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (local_24 != 0) {
      if (local_24 != 0) {
        updateFilteredNormalsGlobalScheme(this,(TriMesh *)filtered_normals_local,pvStack_20);
      }
    }
    else {
      updateFilteredNormalsLocalScheme(this,(TriMesh *)filtered_normals_local,pvStack_20);
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormals(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    // get parameter for normal update
    int denoise_index;
    if(!parameter_set_->getValue(string("Denoise Type"), denoise_index))
        return;

    DenoiseType denoise_type = (denoise_index == 0) ? kLocal : kGlobal;

    if(denoise_type == kLocal)
        updateFilteredNormalsLocalScheme(mesh, filtered_normals);
    else if(denoise_type == kGlobal)
        updateFilteredNormalsGlobalScheme(mesh, filtered_normals);

}